

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv__custom_sem_trywait(uv_sem_t *sem_)

{
  uv_mutex_t *mutex;
  int iVar1;
  uv_semaphore_t *sem;
  uv_sem_t *sem__local;
  
  mutex = *(uv_mutex_t **)sem_;
  iVar1 = uv_mutex_trylock(mutex);
  if (iVar1 == 0) {
    if (*(int *)((long)mutex + 0x58) == 0) {
      uv_mutex_unlock(mutex);
      sem__local._4_4_ = -0xb;
    }
    else {
      *(int *)((long)mutex + 0x58) = *(int *)((long)mutex + 0x58) + -1;
      uv_mutex_unlock(mutex);
      sem__local._4_4_ = 0;
    }
  }
  else {
    sem__local._4_4_ = -0xb;
  }
  return sem__local._4_4_;
}

Assistant:

static int uv__custom_sem_trywait(uv_sem_t* sem_) {
  uv_semaphore_t* sem;

  sem = *(uv_semaphore_t**)sem_;
  if (uv_mutex_trylock(&sem->mutex) != 0)
    return UV_EAGAIN;

  if (sem->value == 0) {
    uv_mutex_unlock(&sem->mutex);
    return UV_EAGAIN;
  }

  sem->value--;
  uv_mutex_unlock(&sem->mutex);

  return 0;
}